

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

char nva_rserrc(nva_err err)

{
  if (err - NVA_ERR_RANGE < 4) {
    return (char)(0x4d534252 >> ((char)(err - NVA_ERR_RANGE) * '\b' & 0x1fU));
  }
  abort();
}

Assistant:

char nva_rserrc(enum nva_err err) {
	switch (err) {
		case NVA_ERR_RANGE:
			return 'R';
		case NVA_ERR_REGSZ:
			return 'B';
		case NVA_ERR_NOSPC:
			return 'S';
		case NVA_ERR_MAP:
			return 'M';
		default:
			abort();
	}
}